

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

void BinaryenTypeExpand(BinaryenType t,BinaryenType *buf)

{
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar1;
  Type *pTVar2;
  Type TVar3;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar4;
  Type local_48;
  Type types;
  Iterator __begin1;
  
  __begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent = (Type *)0x0;
  local_48.id = t;
  types.id = (uintptr_t)&local_48;
  PVar4 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)wasm::Type::end(&local_48);
  TVar3.id = (uintptr_t)&local_48;
  for (; PVar1.index = (size_t)__begin1.
                               super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                               parent, PVar1.parent = (Type *)TVar3.id, PVar4 != PVar1;
      __begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
           (Type *)((long)&(__begin1.
                            super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                           parent)->id + 1)) {
    pTVar2 = wasm::Type::Iterator::operator*((Iterator *)&types);
    *buf = pTVar2->id;
    buf = buf + 1;
    TVar3 = types;
  }
  return;
}

Assistant:

void BinaryenTypeExpand(BinaryenType t, BinaryenType* buf) {
  Type types(t);
  size_t i = 0;
  for (const auto& type : types) {
    buf[i++] = type.getID();
  }
}